

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::MacroUsageSyntax::setChild(MacroUsageSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined1 uVar1;
  NumericTokenFlags NVar2;
  uint32_t uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  long lVar7;
  
  if (index == 0) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar1 = pvVar5->field_0x2;
    NVar2.raw = (pvVar5->numFlags).raw;
    uVar3 = pvVar5->rawLen;
    pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar5->info;
    (this->super_DirectiveSyntax).directive.kind = pvVar5->kind;
    (this->super_DirectiveSyntax).directive.field_0x2 = uVar1;
    (this->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar2.raw;
    (this->super_DirectiveSyntax).directive.rawLen = uVar3;
    lVar7 = 0x20;
  }
  else {
    ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    lVar7 = 0x28;
    if (*ppSVar4 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar6 = *ppSVar4;
    }
  }
  *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)
   ((long)&(this->super_DirectiveSyntax).super_SyntaxNode.kind + lVar7) = pSVar6;
  return;
}

Assistant:

void MacroUsageSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: args = child.node() ? &child.node()->as<MacroActualArgumentListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}